

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O0

int aead_aegis_128l_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  uint8_t *in_stack_00000088;
  size_t in_stack_00000090;
  size_t *in_stack_00000098;
  uint8_t *in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  uint8_t *in_stack_000000b0;
  aead_aegis_128l_ctx *aegis_ctx;
  uint8_t *nonce_local;
  size_t max_out_tag_len_local;
  size_t *out_tag_len_local;
  uint8_t *out_tag_local;
  uint8_t *out_local;
  EVP_AEAD_CTX *ctx_local;
  
  iVar1 = aegis_128l_seal_scatter
                    (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
                     in_stack_00000090,in_stack_00000088,(size_t)in,(uint8_t *)in_len,
                     (size_t)extra_in,(uint8_t *)extra_in_len,(size_t)ad,(uint8_t *)ad_len,
                     (ulong)ctx->tag_len,(size_t)&ctx->state);
  return iVar1;
}

Assistant:

static int aead_aegis_128l_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;

  return aegis_128l_seal_scatter(
      aegis_ctx->key, out, out_tag, out_tag_len, max_out_tag_len, nonce,
      nonce_len, in, in_len, extra_in, extra_in_len, ad, ad_len, ctx->tag_len);
}